

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

string_view __thiscall slang::ast::ElabSystemTaskSymbol::getMessage(ElabSystemTaskSymbol *this)

{
  SyntaxKind SVar1;
  ArgumentListSyntax *pAVar2;
  Scope *scope;
  Compilation *this_00;
  size_type sVar3;
  Type *args_00;
  _Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true> *p_Var4;
  bool bVar5;
  int iVar6;
  ElabSystemTaskSyntax *pEVar7;
  SyntaxNode *pSVar8;
  OrderedArgumentSyntax *pOVar9;
  PropertyExprSyntax *initialExpr;
  ExpressionSyntax *pEVar10;
  undefined4 extraout_var;
  EmptyArgumentExpression *pEVar11;
  reference ppEVar12;
  logic_error *this_01;
  ElabSystemTaskSymbol *pEVar13;
  LookupLocation LVar14;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar15;
  SourceRange sourceRange;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  string_view sVar17;
  LookupLocation lookupLocation;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_01;
  allocator<char> local_191;
  ElabSystemTaskSymbol *local_190;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> argSpan;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_160;
  __index_type local_140;
  iterator __begin2;
  ASTContext astCtx;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  undefined1 auVar18 [16];
  
  if ((this->message).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    bVar16 = (this->message).
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value;
  }
  else {
    pSVar8 = (this->super_Symbol).originatingSyntax;
    if (pSVar8 == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x22f,"string_view slang::ast::ElabSystemTaskSymbol::getMessage() const");
    }
    pEVar7 = slang::syntax::SyntaxNode::as<slang::syntax::ElabSystemTaskSyntax>(pSVar8);
    pAVar2 = pEVar7->arguments;
    if (pAVar2 != (ArgumentListSyntax *)0x0) {
      scope = (this->super_Symbol).parentScope;
      if (scope == (Scope *)0x0) {
        assert::assertFailed
                  ("scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,0x23b,"string_view slang::ast::ElabSystemTaskSymbol::getMessage() const");
      }
      this_00 = scope->compilation;
      local_190 = this;
      LVar14 = LookupLocation::before(&this->super_Symbol);
      lookupLocation._8_8_ = (Compilation *)(LVar14._8_8_ & 0xffffffff);
      lookupLocation.scope = LVar14.scope;
      ASTContext::ASTContext(&astCtx,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
      args.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
           (pointer)args.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
      args.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      __begin2.index = 0;
      args.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
      sVar3 = (pAVar2->parameters).elements.size_;
      __begin2.list = &pAVar2->parameters;
      do {
        pEVar13 = local_190;
        if ((__begin2.list == &pAVar2->parameters) && (__begin2.index == sVar3 + 1 >> 1)) {
          sVar15.size_ = args.super_SmallVectorBase<const_slang::ast::Expression_*>.len;
          sVar15.data_ = args.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
          argSpan.size_ = args.super_SmallVectorBase<const_slang::ast::Expression_*>.len;
          argSpan.data_ = args.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
          if (args.super_SmallVectorBase<const_slang::ast::Expression_*>.len == 0) {
            sVar15.size_ = 0;
LAB_001a8df9:
            args_01.data_ = (pointer)sVar15.size_;
            args_01.size_ = (size_type)lookupLocation._8_8_;
            bVar16 = createMessage((ElabSystemTaskSymbol *)&astCtx,(ASTContext *)sVar15.data_,
                                   args_01);
            p_Var4 = &(pEVar13->message).
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
            ;
            *(size_t *)
             &(p_Var4->_M_payload).
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload = bVar16._M_len;
            *(char **)((long)&(p_Var4->_M_payload).
                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ._M_payload + 8) = bVar16._M_str;
          }
          else {
            if (local_190->taskKind != StaticAssert) {
              if (local_190->taskKind == Fatal) {
                bVar5 = FmtHelpers::checkFinishNum
                                  (&astCtx,*args.
                                            super_SmallVectorBase<const_slang::ast::Expression_*>.
                                            data_);
                if (!bVar5) goto LAB_001a8e13;
                sVar15 = nonstd::span_lite::
                         span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                                   (&argSpan,1,0xffffffffffffffff);
                argSpan = sVar15;
              }
              goto LAB_001a8df9;
            }
            bVar5 = ASTContext::requireBooleanConvertible
                              (&astCtx,*args.super_SmallVectorBase<const_slang::ast::Expression_*>.
                                        data_);
            if (bVar5) {
              if (argSpan.size_ == 0) {
LAB_001a8f59:
                std::terminate();
              }
              lookupLocation._8_8_ = (Compilation *)0x0;
              ASTContext::eval((ConstantValue *)&local_160,&astCtx,*argSpan.data_,
                               (bitmask<slang::ast::EvalFlags>)0x0);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&local_160);
              pEVar13 = local_190;
              if (local_140 != '\0') {
                if (argSpan.size_ == 0) goto LAB_001a8f59;
                local_190->assertCondition = *argSpan.data_;
                sVar15 = nonstd::span_lite::
                         span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                                   (&argSpan,1,0xffffffffffffffff);
                argSpan = sVar15;
                goto LAB_001a8df9;
              }
            }
LAB_001a8e13:
            (pEVar13->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len = 0;
            (pEVar13->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_str = "";
            bVar16 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x344831) << 0x40);
          }
          if ((pEVar13->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged == false) {
            (pEVar13->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_engaged = true;
          }
          goto LAB_001a8e30;
        }
        pSVar8 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::
                  iterator_base<slang::syntax::ArgumentSyntax_*>::operator*(&__begin2)->
                  super_SyntaxNode;
        pEVar13 = local_190;
        SVar1 = pSVar8->kind;
        lookupLocation._8_8_ = (Compilation *)(ulong)SVar1;
        if (SVar1 == EmptyArgument) {
          args_00 = this_00->voidType;
          lookupLocation._8_8_ = this_00;
          local_160._M_rest._0_16_ =
               (undefined1  [16])slang::syntax::SyntaxNode::sourceRange(pSVar8);
          pEVar11 = BumpAllocator::
                    emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                              (&this_00->super_BumpAllocator,args_00,(SourceRange *)&local_160);
          argSpan.data_ = (pointer)pEVar11;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&args,(Expression **)&argSpan
                    );
        }
        else {
          if (SVar1 != OrderedArgument) {
            if (SVar1 != NamedArgument) {
              this_01 = (logic_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                         ,&local_191);
              std::operator+(&local_b0,&local_d0,":");
              std::__cxx11::to_string(&local_f0,0x253);
              std::operator+(&local_90,&local_b0,&local_f0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &argSpan,&local_90,": ");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_160,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &argSpan,"Default case should be unreachable!");
              std::logic_error::logic_error(this_01,(string *)&local_160);
              __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            sourceRange = slang::syntax::SyntaxNode::sourceRange(pSVar8);
            ASTContext::addDiag(&astCtx,(DiagCode)0x6a0007,sourceRange);
LAB_001a8d41:
            (pEVar13->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len = 0;
            (pEVar13->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_str = "";
            if ((pEVar13->message).
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged == false) {
              (pEVar13->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged = true;
            }
            bVar16 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x344831) << 0x40);
LAB_001a8e30:
            SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
                      (&args.super_SmallVectorBase<const_slang::ast::Expression_*>);
            auVar18._0_8_ = bVar16._M_len;
            auVar18._8_8_ = bVar16._M_str;
            return (string_view)auVar18;
          }
          pOVar9 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedArgumentSyntax>(pSVar8);
          initialExpr = not_null<slang::syntax::PropertyExprSyntax_*>::get(&pOVar9->expr);
          pEVar10 = ASTContext::requireSimpleExpr(&astCtx,initialExpr);
          if (pEVar10 == (ExpressionSyntax *)0x0) goto LAB_001a8d41;
          iVar6 = Expression::bind((int)pEVar10,(sockaddr *)&astCtx,0);
          auVar18 = local_160._M_rest._0_16_;
          local_160._4_4_ = extraout_var;
          local_160._0_4_ = iVar6;
          local_160._8_8_ = auVar18._8_8_;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&args,
                     (Expression **)&local_160);
        }
        ppEVar12 = SmallVectorBase<const_slang::ast::Expression_*>::back
                             (&args.super_SmallVectorBase<const_slang::ast::Expression_*>);
        bVar5 = Expression::bad(*ppEVar12);
        if (bVar5) goto LAB_001a8d41;
        __begin2.index = __begin2.index + 1;
      } while( true );
    }
    (this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = 0;
    (this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = "";
    if ((this->message).
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged == false) {
      (this->message).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = true;
    }
    bVar16 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x344831) << 0x40);
  }
  sVar17._M_len = bVar16._M_len;
  sVar17._M_str = bVar16._M_str;
  return sVar17;
}

Assistant:

string_view ElabSystemTaskSymbol::getMessage() const {
    if (message)
        return *message;

    auto syntax = getSyntax();
    ASSERT(syntax);

    auto empty = [&] {
        message = ""sv;
        return *message;
    };

    auto argSyntax = syntax->as<ElabSystemTaskSyntax>().arguments;
    if (!argSyntax)
        return empty();

    auto scope = getParentScope();
    ASSERT(scope);

    // Bind all arguments.
    auto& comp = scope->getCompilation();
    ASTContext astCtx(*scope, LookupLocation::before(*this));
    SmallVector<const Expression*> args;
    for (auto arg : argSyntax->parameters) {
        switch (arg->kind) {
            case SyntaxKind::OrderedArgument: {
                const auto& oa = arg->as<OrderedArgumentSyntax>();
                if (auto exSyn = astCtx.requireSimpleExpr(*oa.expr))
                    args.push_back(&Expression::bind(*exSyn, astCtx));
                else
                    return empty();
                break;
            }
            case SyntaxKind::NamedArgument:
                astCtx.addDiag(diag::NamedArgNotAllowed, arg->sourceRange());
                return empty();
            case SyntaxKind::EmptyArgument:
                args.push_back(
                    comp.emplace<EmptyArgumentExpression>(comp.getVoidType(), arg->sourceRange()));
                break;
            default:
                ASSUME_UNREACHABLE;
        }

        if (args.back()->bad())
            return empty();
    }

    span<const Expression* const> argSpan = args;
    if (!argSpan.empty()) {
        if (taskKind == ElabSystemTaskKind::Fatal) {
            // If this is a $fatal task, check the finish number. We don't use this
            // for anything, but enforce that it's 0, 1, or 2.
            if (!FmtHelpers::checkFinishNum(astCtx, *argSpan[0]))
                return empty();

            argSpan = argSpan.subspan(1);
        }
        else if (taskKind == ElabSystemTaskKind::StaticAssert) {
            // The first argument is the condition to check.
            if (!astCtx.requireBooleanConvertible(*argSpan[0]) || !astCtx.eval(*argSpan[0]))
                return empty();

            assertCondition = argSpan[0];
            argSpan = argSpan.subspan(1);
        }
    }

    message = createMessage(astCtx, argSpan);
    return *message;
}